

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb.c
# Opt level: O2

void rb_insert_fixup(lgx_rb_t *rbt,lgx_rb_node_t *node)

{
  uintptr_t *puVar1;
  ulong uVar2;
  lgx_rb_node_t *uncle;
  lgx_rb_node_t *plVar3;
  ulong uVar4;
  lgx_rb_node_t *node_00;
  lgx_rb_node_t *node_01;
  
  do {
    while( true ) {
      node_00 = (lgx_rb_node_t *)(node->parent_color & 0xfffffffffffffffc);
      if ((node_00 == (lgx_rb_node_t *)0x0) || (uVar2 = node_00->parent_color, (uVar2 & 1) != 0)) {
        puVar1 = &rbt->root->parent_color;
        *puVar1 = *puVar1 | 1;
        return;
      }
      node_01 = (lgx_rb_node_t *)(uVar2 & 0xfffffffffffffffc);
      plVar3 = node_01->left;
      if (plVar3 == node_00) break;
      if ((plVar3 == (lgx_rb_node_t *)0x0) || (uVar4 = plVar3->parent_color, (uVar4 & 1) != 0)) {
        plVar3 = node_00;
        if (node_00->left == node) {
          rb_rotate_right(rbt,node_00);
          uVar2 = node->parent_color;
          plVar3 = node;
          node = node_00;
        }
        plVar3->parent_color = uVar2 | 1;
        *(byte *)&node_01->parent_color = (byte)node_01->parent_color & 0xfe;
        rb_rotate_left(rbt,node_01);
      }
      else {
LAB_001173ea:
        plVar3->parent_color = uVar4 | 1;
        *(byte *)&node_00->parent_color = (byte)node_00->parent_color | 1;
        *(byte *)&node_01->parent_color = (byte)node_01->parent_color & 0xfe;
        node = node_01;
      }
    }
    plVar3 = node_01->right;
    if ((plVar3 != (lgx_rb_node_t *)0x0) && (uVar4 = plVar3->parent_color, (uVar4 & 1) == 0))
    goto LAB_001173ea;
    plVar3 = node_00;
    if (node_00->right == node) {
      rb_rotate_left(rbt,node_00);
      uVar2 = node->parent_color;
      plVar3 = node;
      node = node_00;
    }
    plVar3->parent_color = uVar2 | 1;
    *(byte *)&node_01->parent_color = (byte)node_01->parent_color & 0xfe;
    rb_rotate_right(rbt,node_01);
  } while( true );
}

Assistant:

void rb_insert_fixup(lgx_rb_t *rbt, lgx_rb_node_t *node) {  
    lgx_rb_node_t *parent, *gparent;  
  
    while ((parent = rb_parent(node)) && rb_is_red(parent)) {
        gparent = rb_parent(parent); 
  
        if (parent == gparent->left) {  
            {
                register lgx_rb_node_t *uncle = gparent->right; 
                if (uncle && rb_is_red(uncle)) {  
                    rb_set_black(uncle);
                    rb_set_black(parent);
                    rb_set_red(gparent);
                    node = gparent;
                    continue;
                }  
            }
  
            if (parent->right == node) {  
                register lgx_rb_node_t *tmp;  
                rb_rotate_left(rbt, parent);
                tmp = parent;
                parent = node;  
                node = tmp;  
            }  
  
            rb_set_black(parent);
            rb_set_red(gparent);
            rb_rotate_right(rbt, gparent);
        } else {
            {
                register lgx_rb_node_t *uncle = gparent->left;  
                if (uncle && rb_is_red(uncle)) {  
                    rb_set_black(uncle);  
                    rb_set_black(parent);  
                    rb_set_red(gparent);  
                    node = gparent;  
                    continue;  
                }
            }
  
            if (parent->left == node) {  
                register lgx_rb_node_t *tmp;  
                rb_rotate_right(rbt, parent);  
                tmp = parent;  
                parent = node;  
                node = tmp;  
            }  
  
            rb_set_black(parent);  
            rb_set_red(gparent);  
            rb_rotate_left(rbt, gparent);  
        }
    }
  
    rb_set_black(rbt->root);  
}